

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O2

Position __thiscall
absl::cord_internal::CordRepBtreeNavigator::Skip(CordRepBtreeNavigator *this,size_t n)

{
  size_t sVar1;
  long lVar2;
  CordRep *this_00;
  CordRepBtree *pCVar3;
  ulong uVar4;
  ulong uVar5;
  ulong index;
  Position PVar6;
  
  index = (ulong)this->index_[0];
  pCVar3 = this->node_[0];
  this_00 = CordRepBtree::Edge(pCVar3,index);
  uVar4 = 0;
  do {
    uVar5 = n - this_00->length;
    if (n < this_00->length) {
      uVar4 = uVar4 & 0xffffffff;
      uVar5 = n;
      while (0 < (int)uVar4) {
        pCVar3 = CordRep::btree(this_00);
        this->index_[uVar4] = (uint8_t)index;
        this->node_[uVar4 - 1] = pCVar3;
        uVar4 = uVar4 - 1;
        index = (ulong)(pCVar3->super_CordRep).storage[1];
        this_00 = CordRepBtree::Edge(pCVar3,index);
        while (sVar1 = this_00->length, this_00->length <= uVar5) {
          index = index + 1;
          if (index == (pCVar3->super_CordRep).storage[2]) {
            __assert_fail("index != node->end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                          ,100,
                          "CordRepBtreeNavigator::Position absl::cord_internal::CordRepBtreeNavigator::Skip(size_t)"
                         );
          }
          this_00 = CordRepBtree::Edge(pCVar3,index);
          uVar5 = uVar5 - sVar1;
        }
      }
      this->index_[0] = (uint8_t)index;
LAB_0015f541:
      PVar6.offset = uVar5;
      PVar6.edge = this_00;
      return PVar6;
    }
    uVar4 = (ulong)(int)uVar4;
    while (index = index + 1, index == (pCVar3->super_CordRep).storage[2]) {
      if ((long)this->height_ <= (long)uVar4) {
        this_00 = (CordRep *)0x0;
        goto LAB_0015f541;
      }
      pCVar3 = this->node_[uVar4 + 1];
      lVar2 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      index = (ulong)this->index_[lVar2];
    }
    this_00 = CordRepBtree::Edge(pCVar3,index);
    n = uVar5;
  } while( true );
}

Assistant:

CordRepBtreeNavigator::Position CordRepBtreeNavigator::Skip(size_t n) {
  int height = 0;
  size_t index = index_[0];
  CordRepBtree* node = node_[0];
  CordRep* edge = node->Edge(index);

  // Overall logic: Find an edge of at least the length we need to skip.
  // We consume all edges which are smaller (i.e., must be 100% skipped).
  // If we exhausted all edges on the current level, we move one level
  // up the tree, and repeat until we either find the edge, or until we hit
  // the top of the tree meaning the skip exceeds tree->length.
  while (n >= edge->length) {
    n -= edge->length;
    while (++index == node->end()) {
      if (++height > height_) return {nullptr, n};
      node = node_[height];
      index = index_[height];
    }
    edge = node->Edge(index);
  }

  // If we moved up the tree, descend down to the leaf level, consuming all
  // edges that must be skipped.
  while (height > 0) {
    node = edge->btree();
    index_[height] = static_cast<uint8_t>(index);
    node_[--height] = node;
    index = node->begin();
    edge = node->Edge(index);
    while (n >= edge->length) {
      n -= edge->length;
      ++index;
      assert(index != node->end());
      edge = node->Edge(index);
    }
  }
  index_[0] = static_cast<uint8_t>(index);
  return {edge, n};
}